

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeFinalizing.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_35::TypeFinalizing::TypeFinalizing(TypeFinalizing *this,bool finalize)

{
  (this->super_Pass).runner = (PassRunner *)0x0;
  (this->super_Pass).name._M_dataplus._M_p = (pointer)&(this->super_Pass).name.field_2;
  (this->super_Pass).name._M_string_length = 0;
  (this->super_Pass).name.field_2._M_local_buf[0] = '\0';
  (this->super_Pass).passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__TypeFinalizing_01126358;
  this->finalize = finalize;
  (this->modifiableTypes)._M_h._M_buckets = &(this->modifiableTypes)._M_h._M_single_bucket;
  (this->modifiableTypes)._M_h._M_bucket_count = 1;
  (this->modifiableTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->modifiableTypes)._M_h._M_element_count = 0;
  (this->modifiableTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->modifiableTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->modifiableTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

TypeFinalizing(bool finalize) : finalize(finalize) {}